

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRProjectionNode.cpp
# Opt level: O1

void __thiscall
MinVR::VRProjectionNode::render
          (VRProjectionNode *this,VRDataIndex *renderState,VRRenderHandler *renderHandler)

{
  pointer pcVar1;
  VRAnyCoreType t;
  VRMatrix4 cameraMat;
  VRMatrix4 viewMat;
  undefined1 local_1f8 [72];
  string local_1b0;
  string local_190;
  undefined1 local_170 [72];
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  VRDataIndex::pushState(renderState);
  pcVar1 = local_1f8 + 0x10;
  local_1f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"ProjectionMatrix","");
  VRDataIndex::addData
            (&local_48,renderState,(string *)local_1f8,
             &(this->_projectionMatrix).super_VRFloatArrayConvertible);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_1f8._0_8_ != pcVar1) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  local_1f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"ProjectionHorizontalClip","")
  ;
  VRDataIndex::addData(&local_68,renderState,(string *)local_1f8,this->_horizontalClip);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_1f8._0_8_ != pcVar1) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  local_1f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"ProjectoinVerticalClip","");
  VRDataIndex::addData(&local_88,renderState,(string *)local_1f8,this->_verticalClip);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_1f8._0_8_ != pcVar1) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  local_1f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"ProjectionFovX","");
  VRDataIndex::addData(&local_a8,renderState,(string *)local_1f8,this->_fovX);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_1f8._0_8_ != pcVar1) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  local_1f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"ProjectionFovY","");
  VRDataIndex::addData(&local_c8,renderState,(string *)local_1f8,this->_fovY);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_1f8._0_8_ != pcVar1) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  local_1f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"ProjectionNearClip","");
  VRDataIndex::addData(&local_e8,renderState,(string *)local_1f8,this->_nearClip);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_1f8._0_8_ != pcVar1) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  local_1f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"ProjectionFarClip","");
  VRDataIndex::addData(&local_108,renderState,(string *)local_1f8,this->_farClip);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_1f8._0_8_ != pcVar1) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  local_170._0_8_ = local_170 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"CameraMatrix","");
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"");
  t = VRDataIndex::getValue(renderState,(string *)local_170,&local_190,true);
  VRMatrix4::VRMatrix4((VRMatrix4 *)local_1f8,t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
    operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
  }
  VRMatrix4::inverse((VRMatrix4 *)local_170,(VRMatrix4 *)local_1f8);
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"ViewMatrix","");
  VRDataIndex::addData(&local_128,renderState,&local_1b0,(VRFloatArrayConvertible *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  VRDisplayNode::render(&this->super_VRDisplayNode,renderState,renderHandler);
  VRDataIndex::popState(renderState);
  VRMatrix4::~VRMatrix4((VRMatrix4 *)local_170);
  VRMatrix4::~VRMatrix4((VRMatrix4 *)local_1f8);
  return;
}

Assistant:

void VRProjectionNode::render(VRDataIndex *renderState, VRRenderHandler *renderHandler)
{
  renderState->pushState();

  renderState->addData("ProjectionMatrix", _projectionMatrix);
  renderState->addData("ProjectionHorizontalClip", _horizontalClip);
  renderState->addData("ProjectoinVerticalClip", _verticalClip);
  renderState->addData("ProjectionFovX", _fovX);
  renderState->addData("ProjectionFovY", _fovY);
  renderState->addData("ProjectionNearClip", _nearClip);
  renderState->addData("ProjectionFarClip", _farClip);

  VRMatrix4 cameraMat = renderState->getValue("CameraMatrix");

  VRMatrix4 viewMat = cameraMat.inverse();

  renderState->addData("ViewMatrix", viewMat);

  VRDisplayNode::render(renderState, renderHandler);

  renderState->popState();

}